

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QWidget_*,_QRect> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget*,QRect>>::findNode<QWidget*>
          (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *this,QWidget **key)

{
  long lVar1;
  bool bVar2;
  Node<QWidget_*,_QRect> *pNVar3;
  QWidget **in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QWidget_*,_QRect>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QWidget*>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Data<QHashPrivate::Node<QWidget_*,_QRect>_>::Bucket::isUnused((Bucket *)0x9ace3b);
  if (bVar2) {
    pNVar3 = (Node<QWidget_*,_QRect> *)0x0;
  }
  else {
    pNVar3 = Data<QHashPrivate::Node<QWidget_*,_QRect>_>::Bucket::node((Bucket *)0x9ace56);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }